

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# X3DImporter_Metadata.cpp
# Opt level: O2

bool __thiscall Assimp::X3DImporter::ParseHelper_CheckRead_X3DMetadataObject(X3DImporter *this)

{
  bool bVar1;
  allocator<char> local_31;
  string local_30;
  
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_30,"MetadataBoolean",&local_31);
  bVar1 = XML_CheckNode_NameEqual(this,&local_30);
  std::__cxx11::string::~string((string *)&local_30);
  if (bVar1) {
    ParseNode_MetadataBoolean(this);
  }
  else {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_30,"MetadataDouble",&local_31);
    bVar1 = XML_CheckNode_NameEqual(this,&local_30);
    std::__cxx11::string::~string((string *)&local_30);
    if (bVar1) {
      ParseNode_MetadataDouble(this);
    }
    else {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_30,"MetadataFloat",&local_31);
      bVar1 = XML_CheckNode_NameEqual(this,&local_30);
      std::__cxx11::string::~string((string *)&local_30);
      if (bVar1) {
        ParseNode_MetadataFloat(this);
      }
      else {
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_30,"MetadataInteger",&local_31);
        bVar1 = XML_CheckNode_NameEqual(this,&local_30);
        std::__cxx11::string::~string((string *)&local_30);
        if (bVar1) {
          ParseNode_MetadataInteger(this);
        }
        else {
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_30,"MetadataSet",&local_31);
          bVar1 = XML_CheckNode_NameEqual(this,&local_30);
          std::__cxx11::string::~string((string *)&local_30);
          if (bVar1) {
            ParseNode_MetadataSet(this);
          }
          else {
            std::__cxx11::string::string<std::allocator<char>>
                      ((string *)&local_30,"MetadataString",&local_31);
            bVar1 = XML_CheckNode_NameEqual(this,&local_30);
            std::__cxx11::string::~string((string *)&local_30);
            if (!bVar1) {
              return false;
            }
            ParseNode_MetadataString(this);
          }
        }
      }
    }
  }
  return true;
}

Assistant:

bool X3DImporter::ParseHelper_CheckRead_X3DMetadataObject()
{
	if(XML_CheckNode_NameEqual("MetadataBoolean"))
		ParseNode_MetadataBoolean();
	else if(XML_CheckNode_NameEqual("MetadataDouble"))
		ParseNode_MetadataDouble();
	else if(XML_CheckNode_NameEqual("MetadataFloat"))
		ParseNode_MetadataFloat();
	else if(XML_CheckNode_NameEqual("MetadataInteger"))
		ParseNode_MetadataInteger();
	else if(XML_CheckNode_NameEqual("MetadataSet"))
		ParseNode_MetadataSet();
	else if(XML_CheckNode_NameEqual("MetadataString"))
		ParseNode_MetadataString();
	else
		return false;

	return true;
}